

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VInvTestLocal(N_Vector X,N_Vector Z,sunindextype local_length,int myid)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint in_ECX;
  long in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  double dVar4;
  double dVar5;
  double ans;
  sunrealtype sVar6;
  int test;
  sunindextype i;
  sunrealtype xval;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunindextype in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  sunrealtype in_stack_ffffffffffffffa8;
  long lVar7;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  int local_28;
  int local_4;
  
  local_28 = 0;
  if (in_RDX < 2) {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length must be >= 2\n",in_RDX);
    local_4 = 1;
  }
  else {
    dVar4 = 1.0 / (double)(int)(in_ECX + 2);
    set_element_range(in_stack_ffffffffffffffc0,(sunindextype)in_stack_ffffffffffffffb8,
                      (sunindextype)dVar4,in_stack_ffffffffffffffa8);
    N_VConst(0,in_RSI);
    dVar5 = get_time();
    iVar2 = N_VInvTestLocal(in_RDI,in_RSI);
    sync_device(in_RDI);
    ans = get_time();
    iVar3 = check_ans(ans,in_stack_ffffffffffffffb8,(sunindextype)dVar4);
    if ((iVar3 == 0) && (iVar2 != 0)) {
      if (in_ECX == 0) {
        printf("PASSED test -- N_VInvTestLocal Case 1\n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n",(ulong)in_ECX);
      local_28 = 1;
    }
    dVar4 = max_time(in_RDI,ans - dVar5);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar4,"N_VInvTestLocal");
    }
    bVar1 = false;
    N_VConst(0,in_RSI);
    for (lVar7 = 0; lVar7 < in_RDX; lVar7 = lVar7 + 1) {
      if (lVar7 % 2 == 0) {
        set_element((N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                    5.48312571557678e-318);
      }
      else {
        set_element((N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
                    5.48302690244761e-318);
      }
    }
    dVar4 = get_time();
    iVar2 = N_VInvTestLocal(in_RDI,in_RSI);
    sync_device(in_RDI);
    dVar5 = get_time();
    for (lVar7 = 0; lVar7 < in_RDX; lVar7 = lVar7 + 1) {
      if (lVar7 % 2 == 0) {
        sVar6 = get_element(in_RSI,lVar7);
        if ((sVar6 != 0.0) || (NAN(sVar6))) {
          bVar1 = true;
        }
      }
      else {
        sVar6 = get_element(in_RSI,lVar7);
        if ((sVar6 != 2.0) || (NAN(sVar6))) {
          bVar1 = true;
        }
      }
    }
    if ((bVar1) || (iVar2 != 0)) {
      printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n",(ulong)in_ECX);
      local_28 = local_28 + 1;
    }
    else if (in_ECX == 0) {
      printf("PASSED test -- N_VInvTestLocal Case 2\n");
    }
    dVar4 = max_time(in_RDI,dVar5 - dVar4);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar4,"N_VInvTestLocal");
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int Test_N_VInvTestLocal(N_Vector X, N_Vector Z, sunindextype local_length,
                         int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype xval;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 2)
  {
    printf("Error Test_N_VInvTestLocal: Local vector length is %ld, length "
           "must be >= 2\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: All elements Nonzero, z[i] = 1/x[i], return True
   */

  /* fill vector data */
  xval = ONE / (myid + 2);
  set_element_range(X, 0, local_length - 1, xval);
  N_VConst(ZERO, Z);

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of myid+2 */
  failure = check_ans(myid + 2, Z, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 1, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 1\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  /*
   * Case 2: Some elements Zero, z[i] = 1/x[i] for x[i] != 0, return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(ZERO, Z);
  for (i = 0; i < local_length; i++)
  {
    if (i % 2) { set_element(X, i, HALF); }
    else { set_element(X, i, ZERO); }
  }

  start_time = get_time();
  test       = N_VInvTestLocal(X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    if (i % 2)
    {
      if (get_element(Z, i) != TWO) { failure = 1; }
    }
    else
    {
      if (get_element(Z, i) != ZERO) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VInvTestLocal Case 2, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VInvTestLocal Case 2\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VInvTestLocal", maxt);

  return (fails);
}